

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ClockingBlockSymbol::serializeTo(ClockingBlockSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  TimingControl *__n;
  ASTSerializer *serializer_00;
  ASTSerializer *in_RSI;
  ClockingBlockSymbol *in_RDI;
  ClockingSkew CVar2;
  ClockingBlockSymbol *unaff_retaddr;
  ClockingSkew skew_1;
  ClockingSkew skew;
  ASTSerializer *in_stack_ffffffffffffff80;
  ASTSerializer *in_stack_ffffffffffffff88;
  EdgeKind local_50;
  ASTSerializer *in_stack_ffffffffffffffb8;
  ClockingSkew *in_stack_ffffffffffffffc0;
  ClockingSkew local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  __n = getEvent(unaff_retaddr);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  CVar2 = getDefaultInputSkew(in_RDI);
  local_30.delay = CVar2.delay;
  local_30.edge = CVar2.edge;
  bVar1 = ClockingSkew::hasValue(&local_30);
  if (bVar1) {
    in_stack_ffffffffffffff88 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,(char *)local_10);
    name._M_str = (char *)in_RSI;
    name._M_len = (size_t)in_stack_ffffffffffffff88;
    ASTSerializer::writeProperty(in_stack_ffffffffffffff80,name);
    ASTSerializer::startObject((ASTSerializer *)0x640cf9);
    ClockingSkew::serializeTo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ASTSerializer::endObject((ASTSerializer *)0x640d12);
  }
  CVar2 = getDefaultOutputSkew(in_RDI);
  serializer_00 = (ASTSerializer *)CVar2.delay;
  local_50 = CVar2.edge;
  bVar1 = ClockingSkew::hasValue((ClockingSkew *)&local_50);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
               (char *)in_stack_ffffffffffffff88);
    name_00._M_str = (char *)in_RSI;
    name_00._M_len = (size_t)in_stack_ffffffffffffff88;
    ASTSerializer::writeProperty(local_10,name_00);
    ASTSerializer::startObject((ASTSerializer *)0x640d6e);
    ClockingSkew::serializeTo(in_stack_ffffffffffffffc0,serializer_00);
    ASTSerializer::endObject((ASTSerializer *)0x640d87);
  }
  return;
}

Assistant:

void ClockingBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("event", getEvent());

    if (auto skew = getDefaultInputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultInputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }

    if (auto skew = getDefaultOutputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultOutputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }
}